

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

_Bool op_s_rri_rot(DisasContext_conflict1 *s,arg_s_rri_rot *a,
                  _func_void_TCGContext_ptr_TCGv_i32_TCGv_i32_TCGv_i32_conflict1 *gen,int logic_cc,
                  StoreRegKind kind)

{
  int reg;
  TCGContext_conflict1 *tcg_ctx;
  TCGContext_conflict1 *s_00;
  byte bVar1;
  _Bool _Var2;
  TCGv_i32 pTVar3;
  TCGTemp *pTVar4;
  uint val;
  uintptr_t o_2;
  TCGv_i32 var;
  uintptr_t o;
  
  tcg_ctx = s->uc->tcg_ctx;
  bVar1 = (byte)a->rot & 0x1f;
  val = (uint)a->imm >> bVar1 | a->imm << 0x20 - bVar1;
  if (a->rot != 0 && logic_cc != 0) {
    tcg_gen_op2_aarch64(tcg_ctx,INDEX_op_movi_i32,(TCGArg)(tcg_ctx->cpu_CF + (long)tcg_ctx),
                        (ulong)(val >> 0x1f));
  }
  pTVar3 = tcg_const_i32_aarch64(tcg_ctx,val);
  reg = a->rn;
  s_00 = s->uc->tcg_ctx;
  pTVar4 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I32,false);
  var = (TCGv_i32)((long)pTVar4 - (long)s_00);
  load_reg_var(s,var,reg);
  (*gen)(tcg_ctx,var,var,pTVar3);
  tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(pTVar3 + (long)tcg_ctx));
  if (logic_cc != 0) {
    if (tcg_ctx->cpu_NF != var) {
      tcg_gen_op2_aarch64(tcg_ctx,INDEX_op_mov_i32,(TCGArg)(tcg_ctx->cpu_NF + (long)tcg_ctx),
                          (TCGArg)((long)tcg_ctx + (long)var));
    }
    if (tcg_ctx->cpu_ZF != var) {
      tcg_gen_op2_aarch64(tcg_ctx,INDEX_op_mov_i32,(TCGArg)(tcg_ctx->cpu_ZF + (long)tcg_ctx),
                          (TCGArg)((long)tcg_ctx + (long)var));
    }
  }
  _Var2 = store_reg_kind(s,a->rd,var,kind);
  return _Var2;
}

Assistant:

static bool op_s_rri_rot(DisasContext *s, arg_s_rri_rot *a,
                         void (*gen)(TCGContext *, TCGv_i32, TCGv_i32, TCGv_i32),
                         int logic_cc, StoreRegKind kind)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i32 tmp1, tmp2;
    uint32_t imm;

    imm = ror32(a->imm, a->rot);
    if (logic_cc && a->rot) {
        tcg_gen_movi_i32(tcg_ctx, tcg_ctx->cpu_CF, imm >> 31);
    }
    tmp2 = tcg_const_i32(tcg_ctx, imm);
    tmp1 = load_reg(s, a->rn);

    gen(tcg_ctx, tmp1, tmp1, tmp2);
    tcg_temp_free_i32(tcg_ctx, tmp2);

    if (logic_cc) {
        gen_logic_CC(tcg_ctx, tmp1);
    }
    return store_reg_kind(s, a->rd, tmp1, kind);
}